

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O2

void __thiscall
Catch::Capturer::captureValues<char[4],int,unsigned_int>
          (Capturer *this,size_t index,char (*value) [4],int *values,uint *values_1)

{
  string sStack_48;
  
  StringMaker<char[4],void>::convert_abi_cxx11_
            (&sStack_48,(StringMaker<char[4],void> *)value,*value);
  captureValue(this,index,&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  captureValues<int,unsigned_int>(this,index + 1,values,values_1);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }